

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

void gen_bnz(dill_stream s,int conditional,int target_label,int op_type)

{
  undefined4 uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  dill_reg tmp_1;
  dill_reg tmp;
  
  switch(in_ECX) {
  case 4:
    (**(code **)(*(long *)(*in_RDI + 0x80) + 0x1d8))
              (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xec),
               (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xee),in_ESI,0,in_EDX);
    break;
  case 5:
    (**(code **)(*(long *)(*in_RDI + 0x80) + 0x1e0))
              (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xf0),
               (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xf2),in_ESI,0,in_EDX);
    break;
  case 6:
    (**(code **)(*(long *)(*in_RDI + 0x80) + 0x1e8))
              (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xf4),
               (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xf6),in_ESI,0,in_EDX);
    break;
  case 7:
    (**(code **)(*(long *)(*in_RDI + 0x80) + 0x1f0))
              (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xf8),
               (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xfa),in_ESI,0,in_EDX);
    break;
  case 8:
    (**(code **)(*(long *)(*in_RDI + 0x80) + 0x1f8))
              (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xfc),
               (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0xfe),in_ESI,0,in_EDX);
    break;
  case 9:
    uVar1 = dill_getreg(in_RDI,9);
    (**(code **)(*in_RDI + 0x108))(0,in_RDI,9,0,uVar1);
    (**(code **)(*(long *)(*in_RDI + 0x78) + 0x200))
              (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0x100),
               (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0x102),in_ESI,uVar1,in_EDX);
    break;
  case 10:
    uVar1 = dill_getreg(in_RDI,10);
    (**(code **)(*in_RDI + 0x108))(0,in_RDI,10,0,uVar1);
    (**(code **)(*(long *)(*in_RDI + 0x78) + 0x208))
              (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0x104),
               (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0x106),in_ESI,uVar1,in_EDX);
    break;
  default:
    fprintf(_stderr,"unhandled case in gen_bnz\n");
  }
  return;
}

Assistant:

static void
gen_bnz(dill_stream s, int conditional, int target_label, int op_type)
{
    switch(op_type) {
    case DILL_I:
	dill_bneii(s, conditional, 0, target_label);	/* op_i_bneii */
	break;
    case DILL_U:
	dill_bneui(s, conditional, 0, target_label);	/* op_i_bneui */
	break;
    case DILL_L:
	dill_bneli(s, conditional, 0, target_label);	/* op_i_bneli */
	break;
    case DILL_P:
	dill_bnepi(s, conditional, 0, target_label);	/* op_i_bnepi */
	break;
    case DILL_UL:
	dill_bneuli(s, conditional, 0, target_label);	/* op_i_bneuli */
	break;
    case DILL_F: {
	dill_reg tmp = dill_getreg(s, DILL_F);
	dill_setf(s, tmp, 0.0);	/* op_i_setf */
	dill_bnef(s, conditional, tmp, target_label);
	break;
    }
    case DILL_D: {
	dill_reg tmp = dill_getreg(s, DILL_D);
	dill_setd(s, tmp, 0.0);
	dill_bned(s, conditional, tmp, target_label);	/* op_i_bned */
	break;
    }
    default:
	fprintf(stderr, "unhandled case in gen_bnz\n");
    }
}